

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall c4::yml::Tree::add_tag_directive(Tree *this,TagDirective *td)

{
  csubstr *pcVar1;
  code *pcVar2;
  char *pcVar3;
  size_t sVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  bool bVar11;
  int iVar12;
  size_t sVar13;
  size_t *psVar14;
  ulong uVar15;
  ro_substr chars;
  char msg [33];
  basic_substring<const_char> local_d8;
  char local_c8 [152];
  basic_substring<const_char> local_30;
  
  if (((td->handle).len == 0) || ((td->handle).str == (char *)0x0)) {
    builtin_strncpy(local_c8,"d.handle.empty()",0x11);
    local_d8.len._0_1_ = 'i';
    local_d8.len._1_1_ = 'l';
    local_d8.len._2_1_ = 'e';
    local_d8.len._3_1_ = 'd';
    local_d8.len._4_1_ = ':';
    local_d8.len._5_1_ = ' ';
    local_d8.len._6_1_ = '!';
    local_d8.len._7_1_ = 't';
    local_d8.str = (char *)0x6166206b63656863;
    if ((s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar2 = (code *)swi(3);
        sVar13 = (*pcVar2)();
        return sVar13;
      }
    }
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6814) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x6814) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_callbacks).m_error)((char *)&local_d8,0x21,LVar5,(this->m_callbacks).m_user_data);
  }
  if (((td->prefix).len == 0) || ((td->prefix).str == (char *)0x0)) {
    builtin_strncpy(local_c8,"d.prefix.empty()",0x11);
    local_d8.len._0_1_ = 'i';
    local_d8.len._1_1_ = 'l';
    local_d8.len._2_1_ = 'e';
    local_d8.len._3_1_ = 'd';
    local_d8.len._4_1_ = ':';
    local_d8.len._5_1_ = ' ';
    local_d8.len._6_1_ = '!';
    local_d8.len._7_1_ = 't';
    local_d8.str = (char *)0x6166206b63656863;
    if ((s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar2 = (code *)swi(3);
        sVar13 = (*pcVar2)();
        return sVar13;
      }
    }
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6815) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x6815) << 0x40,8);
    LVar6.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar6.name.len = 0x65;
    (*(this->m_callbacks).m_error)((char *)&local_d8,0x21,LVar6,(this->m_callbacks).m_user_data);
  }
  if (((td->handle).len == 0) || (*(td->handle).str != '!')) {
    builtin_strncpy(local_c8,"d.handle.begins_with(\'!\'))",0x1b);
    local_d8.len._0_1_ = 'i';
    local_d8.len._1_1_ = 'l';
    local_d8.len._2_1_ = 'e';
    local_d8.len._3_1_ = 'd';
    local_d8.len._4_1_ = ':';
    local_d8.len._5_1_ = ' ';
    local_d8.len._6_1_ = '(';
    local_d8.len._7_1_ = 't';
    local_d8.str = (char *)0x6166206b63656863;
    if ((s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar2 = (code *)swi(3);
        sVar13 = (*pcVar2)();
        return sVar13;
      }
    }
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x6816) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x6816) << 0x40,8);
    LVar7.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar7.name.len = 0x65;
    (*(this->m_callbacks).m_error)((char *)&local_d8,0x2b,LVar7,(this->m_callbacks).m_user_data);
  }
  sVar13 = (td->handle).len;
  if ((sVar13 == 0) || ((td->handle).str[sVar13 - 1] != '!')) {
    builtin_strncpy(local_c8,"d.handle.ends_with(\'!\'))",0x19);
    local_d8.len._0_1_ = 'i';
    local_d8.len._1_1_ = 'l';
    local_d8.len._2_1_ = 'e';
    local_d8.len._3_1_ = 'd';
    local_d8.len._4_1_ = ':';
    local_d8.len._5_1_ = ' ';
    local_d8.len._6_1_ = '(';
    local_d8.len._7_1_ = 't';
    local_d8.str = (char *)0x6166206b63656863;
    if ((s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar2 = (code *)swi(3);
        sVar13 = (*pcVar2)();
        return sVar13;
      }
    }
    LVar8.super_LineCol.col = 0;
    LVar8.super_LineCol.offset = SUB168(ZEXT816(0x6817) << 0x40,0);
    LVar8.super_LineCol.line = SUB168(ZEXT816(0x6817) << 0x40,8);
    LVar8.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar8.name.len = 0x65;
    (*(this->m_callbacks).m_error)((char *)&local_d8,0x29,LVar8,(this->m_callbacks).m_user_data);
  }
  iVar12 = basic_substring<const_char>::compare(&td->handle,'!');
  if (iVar12 != 0) {
    iVar12 = basic_substring<const_char>::compare(&td->handle,"!!",2);
    if (iVar12 != 0) {
      local_d8 = basic_substring<const_char>::triml(&td->handle,'!');
      local_30 = basic_substring<const_char>::trimr(&local_d8,'!');
      chars.len = 0x40;
      chars.str = "01234567890abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-";
      sVar13 = basic_substring<const_char>::first_not_of(&local_30,chars,0);
      if (sVar13 != 0xffffffffffffffff) {
        memcpy(&local_d8,
               "check failed: (td.handle == \'!\' || td.handle == \"!!\" || td.handle.trim(\'!\').first_not_of(\"01234567890abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-\") == npos)"
               ,0xa6);
        if ((s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar2 = (code *)swi(3);
            sVar13 = (*pcVar2)();
            return sVar13;
          }
        }
        LVar9.super_LineCol.col = 0;
        LVar9.super_LineCol.offset = SUB168(ZEXT816(0x6819) << 0x40,0);
        LVar9.super_LineCol.line = SUB168(ZEXT816(0x6819) << 0x40,8);
        LVar9.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar9.name.len = 0x65;
        (*(this->m_callbacks).m_error)((char *)&local_d8,0xa6,LVar9,(this->m_callbacks).m_user_data)
        ;
      }
    }
  }
  psVar14 = &this->m_tag_directives[0].handle.len;
  uVar15 = 0;
  do {
    if ((*psVar14 == 0) || (((csubstr *)(psVar14 + -1))->str == (char *)0x0)) goto LAB_0021704b;
    uVar15 = uVar15 + 1;
    psVar14 = psVar14 + 5;
  } while (uVar15 != 4);
  uVar15 = 4;
LAB_0021704b:
  if (3 < uVar15) {
    builtin_strncpy(local_c8,"s < RYML_MAX_TAG_DIRECTIVES",0x1c);
    local_d8.len._0_1_ = 'i';
    local_d8.len._1_1_ = 'l';
    local_d8.len._2_1_ = 'e';
    local_d8.len._3_1_ = 'd';
    local_d8.len._4_1_ = ':';
    local_d8.len._5_1_ = ' ';
    local_d8.len._6_1_ = 'p';
    local_d8.len._7_1_ = 'o';
    local_d8.str = (char *)0x6166206b63656863;
    if ((s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar2 = (code *)swi(3);
        sVar13 = (*pcVar2)();
        return sVar13;
      }
    }
    LVar10.super_LineCol.col = 0;
    LVar10.super_LineCol.offset = SUB168(ZEXT816(0x681b) << 0x40,0);
    LVar10.super_LineCol.line = SUB168(ZEXT816(0x681b) << 0x40,8);
    LVar10.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar10.name.len = 0x65;
    (*(this->m_callbacks).m_error)((char *)&local_d8,0x2c,LVar10,(this->m_callbacks).m_user_data);
  }
  this->m_tag_directives[uVar15].next_node_id = td->next_node_id;
  pcVar3 = (td->handle).str;
  sVar13 = (td->handle).len;
  sVar4 = (td->prefix).len;
  pcVar1 = &this->m_tag_directives[uVar15].prefix;
  pcVar1->str = (td->prefix).str;
  pcVar1->len = sVar4;
  this->m_tag_directives[uVar15].handle.str = pcVar3;
  this->m_tag_directives[uVar15].handle.len = sVar13;
  return uVar15;
}

Assistant:

size_t Tree::add_tag_directive(TagDirective const& td)
{
    _RYML_CB_CHECK(m_callbacks, !td.handle.empty());
    _RYML_CB_CHECK(m_callbacks, !td.prefix.empty());
    _RYML_CB_ASSERT(m_callbacks, td.handle.begins_with('!'));
    _RYML_CB_ASSERT(m_callbacks, td.handle.ends_with('!'));
    // https://yaml.org/spec/1.2.2/#rule-ns-word-char
    _RYML_CB_ASSERT(m_callbacks, td.handle == '!' || td.handle == "!!" || td.handle.trim('!').first_not_of("01234567890abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-") == npos);
    size_t pos = num_tag_directives();
    _RYML_CB_CHECK(m_callbacks, pos < RYML_MAX_TAG_DIRECTIVES);
    m_tag_directives[pos] = td;
    return pos;
}